

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O1

uint8_t * MMFW_EntryData(MMFWEntry *entry)

{
  uint uVar1;
  
  uVar1 = entry->kind - MMFW_KIND_SOUNDS;
  if (uVar1 < 3) {
    return *(uint8_t **)
            ((long)&((entry->entry).sound)->unknown + *(long *)(&DAT_00104158 + (ulong)uVar1 * 8));
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *
MMFW_EntryData(const MMFWEntry *entry)
{
	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		return entry->entry.sound->data;
		break;
	case MMFW_KIND_PICTURES:
		return entry->entry.picture->data;
		break;
	case MMFW_KIND_FILMS:
		return entry->entry.film->data;
		break;
	default:
		return NULL; /* XXX NOTREACHED */
	}
}